

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.cpp
# Opt level: O2

void __thiscall Exception::Exception(Exception *this,ExceptionsEnum exception,string *msg)

{
  allocator local_21;
  
  *(undefined ***)this = &PTR__Exception_00126d30;
  std::__cxx11::string::string((string *)&this->msg,"",&local_21);
  this->exception = exception;
  std::__cxx11::string::_M_assign((string *)&this->msg);
  return;
}

Assistant:

Exception::Exception(ExceptionsEnum exception, const string &msg) {
    this->exception = exception;
    this->msg = msg;
}